

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::Buffer(Buffer *this,char *buf,off_t length)

{
  char *pcVar1;
  ulong uVar2;
  off_t length_local;
  char *buf_local;
  Buffer *this_local;
  
  this->buffer_ = (char *)0x0;
  this->leftIndex_ = 0;
  this->rightIndex_ = 0;
  this->capacity_ = 0;
  uVar2 = length;
  if (length < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pcVar1 = (char *)operator_new__(uVar2);
  this->buffer_ = pcVar1;
  memcpy(this->buffer_,buf,length);
  this->leftIndex_ = 0;
  this->rightIndex_ = length;
  this->capacity_ = length;
  return;
}

Assistant:

Buffer::Buffer(const char *buf, off_t length) {
    buffer_ = new char[length];
    ::memcpy(buffer_, buf, length);
    leftIndex_ = 0;
    rightIndex_ = length;
    capacity_ = length;
}